

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O1

bool all_kv_in_other(gguf_context *ctx,gguf_context *other)

{
  gguf_context *pgVar1;
  uint uVar2;
  gguf_type gVar3;
  gguf_type gVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  long lVar8;
  char *pcVar9;
  void *__s2;
  size_t __n;
  long lVar10;
  void *pvVar11;
  long lVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  string str;
  string str_other;
  allocator<char> local_89;
  gguf_context *local_88;
  long *local_80;
  size_t local_78;
  long local_70 [2];
  long *local_60;
  size_t local_58;
  long local_50 [2];
  void *local_40;
  ulong local_38;
  
  uVar2 = gguf_get_n_kv();
  if ((int)uVar2 < 1) {
    bVar15 = true;
  }
  else {
    local_38 = (ulong)(uVar2 & 0x7fffffff);
    bVar13 = true;
    bVar14 = true;
    bVar15 = true;
    uVar16 = 0;
    local_88 = other;
    do {
      pgVar1 = local_88;
      uVar6 = gguf_get_key(ctx,uVar16);
      uVar2 = gguf_find_key(pgVar1,uVar6);
      if ((int)uVar2 < 0) goto LAB_00108640;
      gVar3 = gguf_get_kv_type(ctx,uVar16);
      uVar2 = uVar2 & 0x7fffffff;
      gVar4 = gguf_get_kv_type(pgVar1,uVar2);
      if (gVar3 == gVar4) {
        if (gVar3 == GGUF_TYPE_STRING) {
          pcVar9 = (char *)gguf_get_val_str(ctx,uVar16);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_80,pcVar9,(allocator<char> *)&local_60);
          pcVar9 = (char *)gguf_get_val_str(local_88,uVar2);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar9,&local_89);
          if (local_78 == local_58) {
            if ((local_78 != 0) &&
               (iVar5 = bcmp(local_80,local_60,local_78), bVar15 = bVar13, bVar14 = bVar13,
               iVar5 != 0)) {
              bVar15 = false;
              bVar14 = bVar15;
              bVar13 = bVar15;
            }
          }
          else {
            bVar15 = false;
            bVar14 = false;
            bVar13 = false;
          }
          if (local_60 != local_50) {
            operator_delete(local_60,local_50[0] + 1);
          }
          if (local_80 != local_70) {
            operator_delete(local_80,local_70[0] + 1);
          }
        }
        else if (gVar3 == GGUF_TYPE_ARRAY) {
          lVar7 = gguf_get_arr_n(ctx,uVar16);
          pgVar1 = local_88;
          lVar8 = gguf_get_arr_n(local_88,uVar2);
          if (lVar7 == lVar8) {
            gVar3 = gguf_get_arr_type(ctx,uVar16);
            gVar4 = gguf_get_arr_type(pgVar1,uVar2);
            if (gVar3 == gVar4) {
              if (gVar3 == GGUF_TYPE_BOOL) {
                lVar8 = gguf_get_arr_data(ctx,uVar16);
                lVar10 = gguf_get_arr_data(local_88,uVar2);
                if (lVar7 != 0) {
                  lVar12 = 0;
                  do {
                    if ((*(char *)(lVar10 + lVar12) == '\0') == (*(char *)(lVar8 + lVar12) != '\0'))
                    {
                      bVar15 = false;
                    }
                    lVar12 = lVar12 + 1;
                    bVar14 = bVar15;
                    bVar13 = bVar15;
                  } while (lVar7 != lVar12);
                }
              }
              else if (gVar3 == GGUF_TYPE_STRING) {
                if (lVar7 != 0) {
                  lVar8 = 0;
                  do {
                    pcVar9 = (char *)gguf_get_arr_str(ctx,uVar16,lVar8);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_80,pcVar9,(allocator<char> *)&local_60);
                    pcVar9 = (char *)gguf_get_arr_str(local_88,uVar2,lVar8);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_60,pcVar9,&local_89);
                    if (local_78 == local_58) {
                      if ((local_78 != 0) &&
                         (iVar5 = bcmp(local_80,local_60,local_78), bVar15 = bVar14, bVar13 = bVar14
                         , iVar5 != 0)) {
                        bVar15 = false;
                        bVar14 = bVar15;
                        bVar13 = bVar15;
                      }
                    }
                    else {
                      bVar15 = false;
                      bVar14 = false;
                      bVar13 = false;
                    }
                    if (local_60 != local_50) {
                      operator_delete(local_60,local_50[0] + 1);
                    }
                    if (local_80 != local_70) {
                      operator_delete(local_80,local_70[0] + 1);
                    }
                    lVar8 = lVar8 + 1;
                  } while (lVar7 != lVar8);
                }
              }
              else {
                local_40 = (void *)gguf_get_arr_data(ctx,uVar16);
                pvVar11 = (void *)gguf_get_arr_data(local_88,uVar2);
                lVar8 = gguf_type_size(gVar3);
                if ((lVar8 * lVar7 != 0) &&
                   (iVar5 = bcmp(local_40,pvVar11,lVar8 * lVar7), bVar15 = bVar13, bVar14 = bVar13,
                   iVar5 != 0)) {
                  bVar15 = false;
                  bVar14 = bVar15;
                  bVar13 = bVar15;
                }
              }
              goto LAB_00108649;
            }
          }
LAB_00108640:
          bVar15 = false;
          bVar14 = false;
          bVar13 = false;
        }
        else {
          pvVar11 = (void *)gguf_get_val_data(ctx,uVar16);
          __s2 = (void *)gguf_get_val_data(local_88,uVar2);
          __n = gguf_type_size(gVar3);
          if ((__n != 0) &&
             (iVar5 = bcmp(pvVar11,__s2,__n), bVar15 = bVar13, bVar14 = bVar13, iVar5 != 0)) {
            bVar15 = false;
            bVar14 = bVar15;
            bVar13 = bVar15;
          }
        }
      }
      else {
        bVar15 = false;
        bVar14 = false;
        bVar13 = false;
      }
LAB_00108649:
      uVar16 = uVar16 + 1;
    } while (uVar16 != local_38);
  }
  return bVar15;
}

Assistant:

static bool all_kv_in_other(const gguf_context * ctx, const gguf_context * other) {
    bool ok = true;

    const int n_kv = gguf_get_n_kv(ctx);
    for (int id = 0; id < n_kv; ++id) {
        const char * name = gguf_get_key(ctx, id);

        const int idx_other = gguf_find_key(other, name);
        if (idx_other < 0) {
            ok = false;
            continue;
        }

        const gguf_type type = gguf_get_kv_type(ctx, id);
        if (type != gguf_get_kv_type(other, idx_other)) {
            ok = false;
            continue;
        }

        if (type == GGUF_TYPE_ARRAY) {
            const size_t arr_n = gguf_get_arr_n(ctx, id);
            if (arr_n != gguf_get_arr_n(other, idx_other)) {
                ok = false;
                continue;
            }

            const gguf_type type_arr = gguf_get_arr_type(ctx, id);
            if (type_arr != gguf_get_arr_type(other, idx_other)) {
                ok = false;
                continue;
            }

            if (type_arr == GGUF_TYPE_BOOL) {
                const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
                const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    if (bool(data[arr_i]) != bool(data_other[arr_i])) {
                        ok = false;
                    }
                }
                continue;
            }

            if (type_arr == GGUF_TYPE_STRING) {
                for (size_t arr_i = 0; arr_i < arr_n; ++arr_i) {
                    const std::string str       = gguf_get_arr_str(ctx,   id,       arr_i);
                    const std::string str_other = gguf_get_arr_str(other, idx_other, arr_i);
                    if (str != str_other) {
                        ok = false;
                    }
                }
                continue;
            }

            const int8_t * data       = reinterpret_cast<const int8_t *>(gguf_get_arr_data(ctx,   id));
            const int8_t * data_other = reinterpret_cast<const int8_t *>(gguf_get_arr_data(other, idx_other));
            if (!std::equal(data, data + arr_n*gguf_type_size(type_arr), data_other)) {
                ok = false;
            }
            continue;
        }

        if (type == GGUF_TYPE_STRING) {
            const std::string str       = gguf_get_val_str(ctx,   id);
            const std::string str_other = gguf_get_val_str(other, idx_other);
            if (str != str_other) {
                ok = false;
            }
            continue;
        }

        const char * data       = reinterpret_cast<const char *>(gguf_get_val_data(ctx,   id));
        const char * data_other = reinterpret_cast<const char *>(gguf_get_val_data(other, idx_other));
        if (!std::equal(data, data + gguf_type_size(type), data_other)) {
            ok = false;
        }
    }

    return ok;
}